

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error IsMacResource(FT_Library library,FT_Stream stream,FT_Long resource_offset,
                      FT_Long face_index,FT_Face *aface)

{
  FT_Long face_index_internal;
  FT_Long count;
  FT_Long *data_offsets;
  FT_Long rdata_pos;
  FT_Long map_offset;
  FT_Memory pFStack_40;
  FT_Error error;
  FT_Memory memory;
  FT_Face *aface_local;
  FT_Long face_index_local;
  FT_Long resource_offset_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  pFStack_40 = library->memory;
  memory = (FT_Memory)aface;
  aface_local = (FT_Face *)face_index;
  face_index_local = resource_offset;
  resource_offset_local = (FT_Long)stream;
  stream_local = (FT_Stream)library;
  map_offset._4_4_ =
       FT_Raccess_Get_HeaderInfo(library,stream,resource_offset,&rdata_pos,(FT_Long *)&data_offsets)
  ;
  library_local._4_4_ = map_offset._4_4_;
  if (map_offset._4_4_ == 0) {
    map_offset._4_4_ =
         FT_Raccess_Get_DataOffsets
                   ((FT_Library)stream_local,(FT_Stream)resource_offset_local,rdata_pos,
                    (FT_Long)data_offsets,0x504f5354,'\x01',(FT_Long **)&count,&face_index_internal)
    ;
    if (map_offset._4_4_ == 0) {
      map_offset._4_4_ =
           Mac_Read_POST_Resource
                     ((FT_Library)stream_local,(FT_Stream)resource_offset_local,(FT_Long *)count,
                      face_index_internal,(FT_Long)aface_local,(FT_Face *)memory);
      ft_mem_free(pFStack_40,(void *)count);
      if (map_offset._4_4_ == 0) {
        *(undefined8 *)memory->user = 1;
      }
      library_local._4_4_ = map_offset._4_4_;
    }
    else {
      map_offset._4_4_ =
           FT_Raccess_Get_DataOffsets
                     ((FT_Library)stream_local,(FT_Stream)resource_offset_local,rdata_pos,
                      (FT_Long)data_offsets,0x73666e74,'\0',(FT_Long **)&count,&face_index_internal)
      ;
      if (map_offset._4_4_ == 0) {
        map_offset._4_4_ =
             Mac_Read_sfnt_Resource
                       ((FT_Library)stream_local,(FT_Stream)resource_offset_local,(FT_Long *)count,
                        face_index_internal,(long)aface_local % face_index_internal,
                        (FT_Face *)memory);
        ft_mem_free(pFStack_40,(void *)count);
        if (map_offset._4_4_ == 0) {
          *(FT_Long *)memory->user = face_index_internal;
        }
      }
      library_local._4_4_ = map_offset._4_4_;
    }
  }
  return library_local._4_4_;
}

Assistant:

static FT_Error
  IsMacResource( FT_Library  library,
                 FT_Stream   stream,
                 FT_Long     resource_offset,
                 FT_Long     face_index,
                 FT_Face    *aface )
  {
    FT_Memory  memory = library->memory;
    FT_Error   error;
    FT_Long    map_offset, rdata_pos;
    FT_Long    *data_offsets;
    FT_Long    count;


    error = FT_Raccess_Get_HeaderInfo( library, stream, resource_offset,
                                       &map_offset, &rdata_pos );
    if ( error )
      return error;

    /* POST resources must be sorted to concatenate properly */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_POST, TRUE,
                                        &data_offsets, &count );
    if ( !error )
    {
      error = Mac_Read_POST_Resource( library, stream, data_offsets, count,
                                      face_index, aface );
      FT_FREE( data_offsets );
      /* POST exists in an LWFN providing a single face */
      if ( !error )
        (*aface)->num_faces = 1;
      return error;
    }

    /* sfnt resources should not be sorted to preserve the face order by
       QuickDraw API */
    error = FT_Raccess_Get_DataOffsets( library, stream,
                                        map_offset, rdata_pos,
                                        TTAG_sfnt, FALSE,
                                        &data_offsets, &count );
    if ( !error )
    {
      FT_Long  face_index_internal = face_index % count;


      error = Mac_Read_sfnt_Resource( library, stream, data_offsets, count,
                                      face_index_internal, aface );
      FT_FREE( data_offsets );
      if ( !error )
        (*aface)->num_faces = count;
    }

    return error;
  }